

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

LocalTableStorage * __thiscall
duckdb::LocalTableManager::GetOrCreateStorage
          (LocalTableManager *this,ClientContext *context,DataTable *table)

{
  int iVar1;
  __node_base_ptr p_Var2;
  LocalTableStorage *pLVar3;
  __hash_code __code;
  shared_ptr<duckdb::LocalTableStorage,_true> new_storage;
  undefined1 local_49;
  shared_ptr<duckdb::LocalTableStorage,_true> local_48;
  shared_ptr<duckdb::LocalTableStorage> local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    local_38.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)table;
    p_Var2 = ::std::
             _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->table_storage)._M_h,
                        (ulong)table % (this->table_storage)._M_h._M_bucket_count,
                        (key_type *)&local_38,(__hash_code)table);
    if ((p_Var2 == (__node_base_ptr)0x0) || (p_Var2->_M_nxt == (_Hash_node_base *)0x0)) {
      local_38.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::LocalTableStorage,std::allocator<duckdb::LocalTableStorage>,duckdb::ClientContext&,duckdb::DataTable&>
                (&local_38.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(LocalTableStorage **)&local_38,
                 (allocator<duckdb::LocalTableStorage> *)&local_49,context,table);
      shared_ptr<duckdb::LocalTableStorage,_true>::shared_ptr(&local_48,&local_38);
      if ((LocalTableStorage *)
          local_38.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (LocalTableStorage *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.
                   super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pLVar3 = local_48.internal.
               super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_38.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.internal.
               super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_28 = local_48.internal.
                 super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      local_48.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (LocalTableStorage *)0x0;
      local_48.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_38.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)table;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::DataTable>,std::pair<std::reference_wrapper<duckdb::DataTable>const,duckdb::shared_ptr<duckdb::LocalTableStorage,true>>,std::allocator<std::pair<std::reference_wrapper<duckdb::DataTable>const,duckdb::shared_ptr<duckdb::LocalTableStorage,true>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::DataTable>,duckdb::ReferenceHashFunction<duckdb::DataTable>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<duckdb::DataTable&,duckdb::shared_ptr<duckdb::LocalTableStorage,true>>>
                ((_Hashtable<std::reference_wrapper<duckdb::DataTable>,std::pair<std::reference_wrapper<duckdb::DataTable>const,duckdb::shared_ptr<duckdb::LocalTableStorage,true>>,std::allocator<std::pair<std::reference_wrapper<duckdb::DataTable>const,duckdb::shared_ptr<duckdb::LocalTableStorage,true>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::DataTable>,duckdb::ReferenceHashFunction<duckdb::DataTable>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->table_storage);
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      }
      if (local_48.internal.
          super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.internal.
                   super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      pLVar3 = (LocalTableStorage *)p_Var2->_M_nxt[2]._M_nxt;
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return pLVar3;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

LocalTableStorage &LocalTableManager::GetOrCreateStorage(ClientContext &context, DataTable &table) {
	lock_guard<mutex> l(table_storage_lock);
	auto entry = table_storage.find(table);
	if (entry == table_storage.end()) {
		auto new_storage = make_shared_ptr<LocalTableStorage>(context, table);
		auto storage = new_storage.get();
		table_storage.insert(make_pair(reference<DataTable>(table), std::move(new_storage)));
		return *storage;
	} else {
		return *entry->second.get();
	}
}